

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void idx2::Resize<idx2::stack_string<128>>(array<idx2::stack_string<128>_> *Array,i64 NewSize)

{
  byte *pbVar1;
  long lVar2;
  undefined1 auVar3 [16];
  
  if (Array->Capacity < NewSize) {
    GrowCapacity<idx2::stack_string<128>>(Array,NewSize);
  }
  if (Array->Size < NewSize) {
    pbVar1 = (Array->Buffer).Data;
    lVar2 = Array->Size * 0x81;
    auVar3 = ZEXT816(0) << 0x40;
    do {
      *(undefined1 (*) [32])(pbVar1 + lVar2 + 0x60) = ZEXT1632(auVar3);
      *(undefined1 (*) [32])(pbVar1 + lVar2 + 0x40) = ZEXT1632(auVar3);
      *(undefined1 (*) [32])(pbVar1 + lVar2 + 0x20) = ZEXT1632(auVar3);
      *(undefined1 (*) [32])(pbVar1 + lVar2) = ZEXT1632(auVar3);
      pbVar1[lVar2 + 0x80] = '\0';
      lVar2 = lVar2 + 0x81;
    } while (NewSize * 0x81 != lVar2);
  }
  Array->Size = NewSize;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}